

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

void __thiscall
baryonyx::itm::default_cost_type<double>::
make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
          (default_cost_type<double> *this,int n,
          linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *rng)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double *pdVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  ulong uVar12;
  undefined8 extraout_RAX;
  int *piVar13;
  double *pdVar14;
  ulong uVar15;
  double *pdVar16;
  pointer ppVar17;
  pointer ppVar18;
  pointer ppVar19;
  long lVar20;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_double>
  __aurng;
  pointer ppVar21;
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> r;
  allocator_type local_61;
  double local_60;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> local_58;
  ulong local_40;
  default_cost_type<double> *local_38;
  
  local_38 = this;
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::vector
            (&local_58,(long)n,&local_61);
  local_40 = (ulong)(uint)n;
  if (n != 0) {
    uVar15 = 0;
    pdVar4 = (local_38->linear_elements)._M_t.
             super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl;
    piVar13 = &(local_58.
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->second;
    do {
      ((pair<double,_int> *)(piVar13 + -2))->first = pdVar4[uVar15];
      *piVar13 = (int)uVar15;
      uVar15 = uVar15 + 1;
      piVar13 = piVar13 + 4;
    } while (local_40 != uVar15);
  }
  ppVar18 = local_58.
            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppVar21 = local_58.
            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (local_58.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_58.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::default_cost_type<double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              (local_58.
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               local_58.
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,
               (int)LZCOUNT((long)local_58.
                                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_58.
                                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::default_cost_type<double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              ();
    ppVar21 = local_58.
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppVar18 = local_58.
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    for (ppVar19 = local_58.
                   super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppVar19 != ppVar21;
        ppVar19 = ppVar19 + 1) {
      dVar27 = ppVar18->first;
      dVar26 = ppVar19->first;
      if (((dVar26 != dVar27) || (ppVar17 = ppVar18, NAN(dVar26) || NAN(dVar27))) &&
         (ppVar17 = ppVar19, 0x10 < (long)ppVar19 - (long)ppVar18)) {
        local_60 = dVar26 - dVar27;
        do {
          auVar22._0_8_ =
               std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (rng);
          auVar22._8_56_ = extraout_var;
          auVar30._8_8_ = 0;
          auVar30._0_8_ = local_60;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = dVar27;
          auVar1 = vfmadd213sd_fma(auVar22._0_16_,auVar30,auVar1);
          ppVar18->first = auVar1._0_8_;
          ppVar18 = ppVar18 + 1;
        } while (ppVar18 != ppVar19);
      }
      ppVar18 = ppVar17;
    }
  }
  if (0x10 < (long)ppVar21 - (long)ppVar18) {
    if ((long)ppVar18 -
        (long)local_58.
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start == 0) {
      dVar27 = ppVar18->first;
      dVar26 = dVar27 + 1.0;
      if ((dVar27 == dVar26) && (!NAN(dVar27) && !NAN(dVar26))) goto LAB_00176da1;
      if (ppVar18 != ppVar21) {
        local_60 = dVar26 - dVar27;
        do {
          auVar23._0_8_ =
               std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (rng);
          auVar23._8_56_ = extraout_var_01;
          auVar32._8_8_ = 0;
          auVar32._0_8_ = local_60;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = dVar27;
          auVar1 = vfmadd213sd_fma(auVar23._0_16_,auVar32,auVar3);
          ppVar18->first = auVar1._0_8_;
          ppVar18 = ppVar18 + 1;
        } while (ppVar18 != ppVar21);
      }
    }
    else {
      dVar26 = linearize<long,double>
                         (0,(local_58.
                             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->first,
                          (long)ppVar18 -
                          (long)local_58.
                                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4,ppVar18->first,
                          (long)local_58.
                                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_58.
                                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4);
      dVar27 = ppVar18->first;
      if ((dVar27 == dVar26) && (!NAN(dVar27) && !NAN(dVar26))) {
        make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>();
LAB_00176da1:
        make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>();
        if (local_58.
            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.
                          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_58.
                                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.
                                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        _Unwind_Resume(extraout_RAX);
      }
      if (ppVar18 != ppVar21) {
        local_60 = dVar26 - dVar27;
        do {
          auVar24._0_8_ =
               std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (rng);
          auVar24._8_56_ = extraout_var_00;
          auVar31._8_8_ = 0;
          auVar31._0_8_ = local_60;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = dVar27;
          auVar1 = vfmadd213sd_fma(auVar24._0_16_,auVar31,auVar2);
          ppVar18->first = auVar1._0_8_;
          ppVar18 = ppVar18 + 1;
        } while (ppVar18 != ppVar21);
      }
    }
  }
  ppVar18 = local_58.
            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (local_58.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_58.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::default_cost_type<double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_2_>>
              (local_58.
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               local_58.
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,
               (int)LZCOUNT((long)local_58.
                                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_58.
                                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::default_cost_type<double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_2_>>
              (ppVar18);
  }
  if (n != 0) {
    lVar20 = 0;
    pdVar4 = (local_38->linear_elements)._M_t.
             super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl;
    do {
      *(undefined8 *)((long)pdVar4 + lVar20) =
           *(undefined8 *)
            ((long)&(local_58.
                     super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->first + lVar20 * 2);
      lVar20 = lVar20 + 8;
    } while (local_40 * 8 - lVar20 != 0);
    pdVar14 = pdVar4;
    if (n != 1) {
      auVar28._8_8_ = 0;
      auVar28._0_8_ = *pdVar4;
      lVar20 = (long)n * 8 + -8;
      pdVar16 = pdVar4;
      do {
        pdVar16 = pdVar16 + 1;
        auVar33._8_8_ = 0;
        auVar33._0_8_ = *pdVar16;
        dVar27 = auVar28._0_8_;
        auVar28 = vmaxsd_avx(auVar33,auVar28);
        if (dVar27 < *pdVar16) {
          pdVar14 = pdVar16;
        }
        lVar20 = lVar20 + -8;
      } while (lVar20 != 0);
    }
    if ((uint)((ulong)((long)ABS(*pdVar14) + -0x10000000000000) >> 0x35) < 0x3ff && n != 0) {
      auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar29._8_8_ = 0;
      auVar29._0_8_ = *pdVar14;
      auVar23 = vpbroadcastq_avx512f(auVar29);
      auVar24 = vpbroadcastq_avx512f();
      uVar15 = 0;
      do {
        auVar25 = vpbroadcastq_avx512f();
        auVar25 = vporq_avx512f(auVar25,auVar22);
        uVar12 = vpcmpuq_avx512f(auVar25,auVar24,2);
        pdVar14 = pdVar4 + uVar15;
        auVar25._8_8_ = (ulong)((byte)(uVar12 >> 1) & 1) * (long)pdVar14[1];
        auVar25._0_8_ = (ulong)((byte)uVar12 & 1) * (long)*pdVar14;
        auVar25._16_8_ = (ulong)((byte)(uVar12 >> 2) & 1) * (long)pdVar14[2];
        auVar25._24_8_ = (ulong)((byte)(uVar12 >> 3) & 1) * (long)pdVar14[3];
        auVar25._32_8_ = (ulong)((byte)(uVar12 >> 4) & 1) * (long)pdVar14[4];
        auVar25._40_8_ = (ulong)((byte)(uVar12 >> 5) & 1) * (long)pdVar14[5];
        auVar25._48_8_ = (ulong)((byte)(uVar12 >> 6) & 1) * (long)pdVar14[6];
        auVar25._56_8_ = (uVar12 >> 7) * (long)pdVar14[7];
        auVar25 = vdivpd_avx512f(auVar25,auVar23);
        pdVar14 = pdVar4 + uVar15;
        bVar5 = (bool)((byte)uVar12 & 1);
        bVar6 = (bool)((byte)(uVar12 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar12 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar12 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar12 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar12 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar12 >> 6) & 1);
        *pdVar14 = (double)((ulong)bVar5 * auVar25._0_8_ | (ulong)!bVar5 * (long)*pdVar14);
        pdVar14[1] = (double)((ulong)bVar6 * auVar25._8_8_ | (ulong)!bVar6 * (long)pdVar14[1]);
        pdVar14[2] = (double)((ulong)bVar7 * auVar25._16_8_ | (ulong)!bVar7 * (long)pdVar14[2]);
        pdVar14[3] = (double)((ulong)bVar8 * auVar25._24_8_ | (ulong)!bVar8 * (long)pdVar14[3]);
        pdVar14[4] = (double)((ulong)bVar9 * auVar25._32_8_ | (ulong)!bVar9 * (long)pdVar14[4]);
        pdVar14[5] = (double)((ulong)bVar10 * auVar25._40_8_ | (ulong)!bVar10 * (long)pdVar14[5]);
        pdVar14[6] = (double)((ulong)bVar11 * auVar25._48_8_ | (ulong)!bVar11 * (long)pdVar14[6]);
        pdVar14[7] = (double)((uVar12 >> 7) * auVar25._56_8_ |
                             (ulong)!SUB81(uVar12 >> 7,0) * (long)pdVar14[7]);
        uVar15 = uVar15 + 8;
      } while ((local_40 + 7 & 0xfffffffffffffff8) != uVar15);
    }
  }
  if (local_58.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void make_random_norm(int n, Random& rng)
    {
        std::vector<std::pair<Float, int>> r(n);

        for (int i = 0; i != n; ++i)
            r[i] = { linear_elements[i], i };

        std::sort(r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
            return lhs.first < rhs.first;
        });

        auto begin = r.begin();
        auto end = r.end();
        auto next = r.begin()++;
        for (; next != end; ++next) {
            if (next->first != begin->first) {
                if (std::distance(begin, next) > 1)
                    random_epsilon_unique(
                      begin, next, rng, begin->first, next->first);

                begin = next;
            }
        }

        if (std::distance(begin, end) > 1) {
            if (begin == r.begin()) {
                random_epsilon_unique(
                  begin, end, rng, begin->first, begin->first + 1);
            } else {
                auto value = linearize(std::ptrdiff_t(0),
                                       r.front().first,
                                       std::distance(r.begin(), begin),
                                       begin->first,
                                       std::distance(r.begin(), r.end()));

                random_epsilon_unique(begin, end, rng, begin->first, value);
            }
        }

        // Reorder the vector according to the variable index, so, it
        // restores the initial order.

        std::sort(r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
            return lhs.second < rhs.second;
        });

        for (int i = 0; i != n; ++i)
            linear_elements[i] = r[i].first;

        // Finally we compute the l+oo norm.

        Float div =
          *std::max_element(linear_elements.get(), linear_elements.get() + n);
        if (std::isnormal(div))
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;
    }